

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_SwapImplicitPresenceShouldWork_Test::
TestBody(GeneratedMessageReflection_SwapImplicitPresenceShouldWork_Test *this)

{
  bool bVar1;
  TestAllTypes *pTVar2;
  Reflection *this_00;
  char *message;
  AssertHelper local_128;
  Message local_120;
  int local_118;
  int32_t local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  undefined1 local_f0 [8];
  TestHasbits rhs;
  TestHasbits lhs;
  GeneratedMessageReflection_SwapImplicitPresenceShouldWork_Test *this_local;
  
  proto3_unittest::TestHasbits::TestHasbits((TestHasbits *)((long)&rhs.field_0 + 0x58));
  proto3_unittest::TestHasbits::TestHasbits((TestHasbits *)local_f0);
  pTVar2 = proto3_unittest::TestHasbits::mutable_child((TestHasbits *)local_f0);
  proto3_unittest::TestAllTypes::set_optional_int32(pTVar2,-1);
  this_00 = proto3_unittest::TestHasbits::GetReflection();
  Reflection::Swap(this_00,(Message *)((long)&rhs.field_0 + 0x58),(Message *)local_f0);
  pTVar2 = proto3_unittest::TestHasbits::child((TestHasbits *)((long)&rhs.field_0 + 0x58));
  local_114 = proto3_unittest::TestAllTypes::optional_int32(pTVar2);
  local_118 = -1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_110,"lhs.child().optional_int32()","-1",&local_114,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x711,message);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  proto3_unittest::TestHasbits::~TestHasbits((TestHasbits *)local_f0);
  proto3_unittest::TestHasbits::~TestHasbits((TestHasbits *)((long)&rhs.field_0 + 0x58));
  return;
}

Assistant:

TEST(GeneratedMessageReflection, SwapImplicitPresenceShouldWork) {
  proto3_unittest::TestHasbits lhs, rhs;
  rhs.mutable_child()->set_optional_int32(-1);
  lhs.GetReflection()->Swap(&lhs, &rhs);
  EXPECT_EQ(lhs.child().optional_int32(), -1);
}